

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.h
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::DataChunk::DataChunk(DataChunk *this,ArenaAllocator *allocator,uint initSize)

{
  uchar *puVar1;
  
  this->byteSize = initSize;
  this->nextChunk = (DataChunk *)0x0;
  puVar1 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_char,false>
                     ((Memory *)allocator,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                      (ulong)initSize);
  this->buffer = puVar1;
  this->currentByte = puVar1;
  return;
}

Assistant:

DataChunk(ArenaAllocator* allocator, uint initSize) :
                nextChunk(nullptr),
                byteSize(initSize)
            {
                buffer = AnewArray(allocator, byte, initSize);
                currentByte = buffer;
            }